

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O1

vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
* solver6L<double>(vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                   *__return_storage_ptr__,
                  vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                  *ptPair,vector<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::allocator<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                          *plPair,
                  vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                  *lPair,vector<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
                         *lCPair)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer ppVar5;
  iterator __position;
  undefined8 uVar6;
  undefined8 uVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  long lVar11;
  uint iter;
  long lVar12;
  double dVar13;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar14;
  iterator iVar15;
  undefined1 *puVar16;
  bool bVar17;
  byte bVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L2vec;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  L1vec;
  Matrix<double,_3,_1,_0,_3,_1> R62_B;
  Matrix<double,_3,_1,_0,_3,_1> R61_B;
  Matrix<double,_3,_1,_0,_3,_1> Q62;
  Matrix<double,_3,_1,_0,_3,_1> Q61;
  Matrix<double,_3,_1,_0,_3,_1> R52_B;
  Matrix<double,_3,_1,_0,_3,_1> R51_B;
  Matrix<double,_3,_1,_0,_3,_1> Q52;
  Matrix<double,_3,_1,_0,_3,_1> Q51;
  Matrix<double,_3,_1,_0,_3,_1> R42_B;
  Matrix<double,_3,_1,_0,_3,_1> R41_B;
  Matrix<double,_3,_1,_0,_3,_1> Q42;
  Matrix<double,_3,_1,_0,_3,_1> Q41;
  Matrix<double,_3,_1,_0,_3,_1> R32_B;
  Matrix<double,_3,_1,_0,_3,_1> R31_B;
  Matrix<double,_3,_1,_0,_3,_1> Q32;
  Matrix<double,_3,_1,_0,_3,_1> Q31;
  Matrix<double,_3,_1,_0,_3,_1> R22_B;
  Matrix<double,_3,_1,_0,_3,_1> R21_B;
  Matrix<double,_3,_1,_0,_3,_1> Q22;
  Matrix<double,_3,_1,_0,_3,_1> Q21;
  Matrix<double,_3,_1,_0,_3,_1> R12_B;
  Matrix<double,_3,_1,_0,_3,_1> R11_B;
  Matrix<double,_3,_3,_0,_3,_3> RotationEstimate;
  Matrix<double,_6,_1,_0,_6,_1> L61;
  Matrix<double,_6,_1,_0,_6,_1> L52;
  Matrix<double,_6,_1,_0,_6,_1> L51;
  Matrix<double,_6,_1,_0,_6,_1> L42;
  Matrix<double,_6,_1,_0,_6,_1> L41;
  Matrix<double,_6,_1,_0,_6,_1> L32;
  Matrix<double,_6,_1,_0,_6,_1> L31;
  Matrix<double,_6,_1,_0,_6,_1> L22;
  Matrix<double,_6,_1,_0,_6,_1> L21;
  Matrix<double,_6,_1,_0,_6,_1> L12;
  Matrix<double,_6,_1,_0,_6,_1> L11;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_6,_6,_0,_6,_6> L1;
  Matrix<double,_3,_1,_0,_3,_1> Q12;
  Matrix<double,_3,_1,_0,_3,_1> Q11;
  Matrix<double,_6,_1,_0,_6,_1> k;
  Matrix<double,_6,_1,_0,_6,_1> L62;
  Matrix<double,_6,_6,_0,_6,_6> L2;
  SrcEvaluatorType srcEvaluator_12;
  Matrix<double,_4,_4,_0,_4,_4> TransformationEstimate;
  Matrix<double,_3,_1,_0,_3,_1> solution;
  Matrix<double,_6,_3,_0,_6,_3> A;
  Matrix<double,_64,_64,_0,_64,_64> Action;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> Eig;
  Matrix<std::complex<double>,_64,_64,_0,_64,_64> EV;
  assign_op<double,_double> aStack_41821;
  long lStack_41820;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  vStack_41818;
  vector<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  vStack_417f8;
  double dStack_417d8;
  double dStack_417d0;
  double dStack_417c8;
  double dStack_417b8;
  double dStack_417b0;
  double dStack_417a8;
  double dStack_41798;
  double dStack_41790;
  double dStack_41788;
  double dStack_41778;
  double dStack_41770;
  double dStack_41768;
  double dStack_41758;
  double dStack_41750;
  double dStack_41748;
  double dStack_41738;
  double dStack_41730;
  double dStack_41728;
  double dStack_41718;
  double dStack_41710;
  double dStack_41708;
  double dStack_416f8;
  double dStack_416f0;
  double dStack_416e8;
  double dStack_416d8;
  double dStack_416d0;
  double dStack_416c8;
  double dStack_416b8;
  double dStack_416b0;
  double dStack_416a8;
  double dStack_41698;
  double dStack_41690;
  double dStack_41688;
  double dStack_41678;
  double dStack_41670;
  double dStack_41668;
  double dStack_41658;
  double dStack_41650;
  double dStack_41648;
  double dStack_41638;
  double dStack_41630;
  double dStack_41628;
  double dStack_41618;
  double dStack_41610;
  double dStack_41608;
  double dStack_415f8;
  double dStack_415f0;
  double dStack_415e8;
  double dStack_415d8;
  double dStack_415d0;
  double dStack_415c8;
  double dStack_415b8;
  double dStack_415b0;
  double dStack_415a8;
  double dStack_41598;
  double dStack_41590;
  double dStack_41588;
  double dStack_41578;
  double dStack_41570;
  double dStack_41568;
  double dStack_41558;
  double dStack_41550;
  double dStack_41548;
  double dStack_41538;
  double dStack_41530;
  double dStack_41528;
  Matrix<double,_3,_3,_0,_3,_3> MStack_41518;
  undefined1 auStack_414c8 [16];
  undefined1 auStack_414b8 [16];
  undefined1 auStack_414a8 [16];
  undefined1 auStack_41498 [16];
  undefined1 auStack_41488 [16];
  undefined1 auStack_41478 [16];
  undefined1 auStack_41468 [16];
  undefined1 auStack_41458 [16];
  undefined1 auStack_41448 [16];
  undefined1 auStack_41438 [16];
  undefined1 auStack_41428 [16];
  undefined1 auStack_41418 [16];
  undefined1 auStack_41408 [16];
  undefined1 auStack_413f8 [16];
  undefined1 auStack_413e8 [16];
  undefined1 auStack_413d8 [16];
  undefined1 auStack_413c8 [16];
  undefined1 auStack_413b8 [16];
  undefined1 auStack_413a8 [16];
  undefined1 auStack_41398 [16];
  undefined1 auStack_41388 [16];
  undefined1 auStack_41378 [16];
  undefined1 auStack_41368 [16];
  undefined1 auStack_41358 [16];
  undefined1 auStack_41348 [16];
  undefined1 auStack_41338 [16];
  undefined1 auStack_41328 [16];
  undefined1 auStack_41318 [16];
  undefined1 auStack_41308 [16];
  undefined1 auStack_412f8 [16];
  undefined1 auStack_412e8 [16];
  undefined1 auStack_412d8 [16];
  undefined1 auStack_412c8 [24];
  SrcXprType SStack_412b0;
  Matrix<double,_6,_3,_0,_6,_3> *pMStack_412a0;
  double dStack_41298;
  undefined1 auStack_41290 [24];
  PointerType pdStack_41278;
  double dStack_41270;
  XprTypeNested pMStack_41268;
  variable_if_dynamic<long,__1> vStack_41260;
  variable_if_dynamic<long,__1> vStack_41258;
  double dStack_41250;
  variable_if_dynamic<long,__1> vStack_41248;
  double dStack_41240;
  double dStack_41238;
  Matrix<double,_3,_3,_0,_3,_3> *pMStack_41230;
  PointerType pdStack_41228;
  variable_if_dynamic<long,__1> vStack_41220;
  double dStack_41218;
  PointerType pdStack_41210;
  Matrix<double,_6,_6,_0,_6,_6> *pMStack_41200;
  variable_if_dynamic<long,__1> vStack_411f8;
  variable_if_dynamic<long,__1> vStack_411f0;
  Index IStack_411e8;
  variable_if_dynamic<long,__1> vStack_411e0;
  Index IStack_411d0;
  PointerType pdStack_411c8;
  variable_if_dynamic<long,__1> vStack_411c0;
  PointerType pdStack_411b0;
  XprTypeNested pMStack_411a0;
  variable_if_dynamic<long,__1> vStack_41198;
  variable_if_dynamic<long,__1> vStack_41190;
  Index IStack_41188;
  variable_if_dynamic<long,__1> vStack_41180;
  Index IStack_41170;
  Matrix<double,_3,_3,_0,_3,_3> *pMStack_41168;
  PointerType pdStack_41160;
  variable_if_dynamic<long,__1> vStack_41158;
  PointerType pdStack_41148;
  Matrix<double,_6,_6,_0,_6,_6> *pMStack_41138;
  variable_if_dynamic<long,__1> vStack_41130;
  variable_if_dynamic<long,__1> vStack_41128;
  Index IStack_41120;
  variable_if_dynamic<long,__1> vStack_41118;
  double adStack_41108 [4];
  undefined1 auStack_410e8 [56];
  plainobjectbase_evaluator_data<double,_0> pStack_410b0;
  plainobjectbase_evaluator_data<double,_0> pStack_410a8;
  undefined8 uStack_410a0;
  undefined8 uStack_41098;
  undefined8 uStack_41090;
  Data DStack_41088;
  undefined8 uStack_41070;
  undefined8 uStack_41068;
  undefined8 uStack_41060;
  Data DStack_41058;
  undefined8 uStack_41040;
  undefined8 uStack_41038;
  undefined8 uStack_41030;
  Data DStack_41028;
  undefined8 uStack_41010;
  undefined8 uStack_41008;
  undefined8 uStack_41000;
  undefined1 auStack_40ff8 [16];
  undefined1 auStack_40fe8 [16];
  undefined1 auStack_40fd8 [16];
  double dStack_40fc8;
  double dStack_40fc0;
  double dStack_40fb8;
  double dStack_40fa8;
  double dStack_40fa0;
  double dStack_40f98;
  double adStack_40f88 [4];
  double dStack_40f68;
  double dStack_40f60;
  undefined1 auStack_40f58 [16];
  undefined1 auStack_40f48 [16];
  undefined1 auStack_40f38 [16];
  Matrix<double,_6,_6,_0,_6,_6> MStack_40f28;
  undefined1 auStack_40e08 [16];
  double *pdStack_40df8;
  double dStack_40df0;
  double *pdStack_40de8;
  double dStack_40de0;
  double dStack_40dd8;
  double dStack_40dd0;
  double dStack_40dc8;
  Matrix<double,_6,_3,_0,_6,_3> *pMStack_40dc0;
  Matrix<double,_3,_3,_0,_3,_3> *pMStack_40db8;
  Matrix<double,_6,_3,_0,_6,_3> *pMStack_40db0;
  double adStack_40da8 [2];
  Matrix<double,_4,_4,_0,_4,_4> MStack_40d98;
  Matrix<double,_3,_1,_0,_3,_1> MStack_40d10;
  Matrix<double,_6,_3,_0,_6,_3> MStack_40cf8;
  Matrix<double,_64,_64,_0,_64,_64> MStack_40c68;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> EStack_38c68;
  undefined1 auStack_10038 [16];
  assign_op<double,_double> *paStack_10028;
  EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *pEStack_10020;
  undefined1 local_fc70 [40];
  undefined8 auStack_fc48 [8067];
  
  bVar18 = 0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppVar5 = (lPair->
           super__Vector_base<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>,_std::allocator<std::pair<std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_std::pair<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dStack_40fa8 = *(double *)
                  &(ppVar5->first).first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_40fa0 = *(double *)
                  ((long)&(ppVar5->first).first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  auStack_41290._8_8_ = &dStack_40fa8;
  dStack_40f98 = *(double *)
                  ((long)&(ppVar5->first).first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_40fc8 = (ppVar5->first).second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_40fc0 = *(double *)
                  ((long)&(ppVar5->first).second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  auStack_41290._0_8_ = &dStack_40fc8;
  dStack_40fb8 = *(double *)
                  ((long)&(ppVar5->first).second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41538 = *(double *)
                  &(ppVar5->second).first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41530 = *(double *)
                  ((long)&(ppVar5->second).first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41528 = *(double *)
                  ((long)&(ppVar5->second).first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41558 = (ppVar5->second).second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_41550 = *(double *)
                  ((long)&(ppVar5->second).second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41548 = *(double *)
                  ((long)&(ppVar5->second).second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41578 = *(double *)
                  &ppVar5[1].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_41570 = *(double *)
                  ((long)&ppVar5[1].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41568 = *(double *)
                  ((long)&ppVar5[1].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41598 = ppVar5[1].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_41590 = *(double *)
                  ((long)&ppVar5[1].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41588 = *(double *)
                  ((long)&ppVar5[1].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_415b8 = *(double *)
                  &ppVar5[1].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_415b0 = *(double *)
                  ((long)&ppVar5[1].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_415a8 = *(double *)
                  ((long)&ppVar5[1].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_415d8 = ppVar5[1].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_415d0 = *(double *)
                  ((long)&ppVar5[1].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_415c8 = *(double *)
                  ((long)&ppVar5[1].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_415f8 = *(double *)
                  &ppVar5[2].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_415f0 = *(double *)
                  ((long)&ppVar5[2].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_415e8 = *(double *)
                  ((long)&ppVar5[2].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41618 = ppVar5[2].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_41610 = *(double *)
                  ((long)&ppVar5[2].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41608 = *(double *)
                  ((long)&ppVar5[2].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41638 = *(double *)
                  &ppVar5[2].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41630 = *(double *)
                  ((long)&ppVar5[2].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41628 = *(double *)
                  ((long)&ppVar5[2].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41658 = ppVar5[2].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_41650 = *(double *)
                  ((long)&ppVar5[2].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41648 = *(double *)
                  ((long)&ppVar5[2].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41678 = *(double *)
                  &ppVar5[3].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_41670 = *(double *)
                  ((long)&ppVar5[3].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41668 = *(double *)
                  ((long)&ppVar5[3].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41698 = ppVar5[3].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_41690 = *(double *)
                  ((long)&ppVar5[3].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41688 = *(double *)
                  ((long)&ppVar5[3].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_416b8 = *(double *)
                  &ppVar5[3].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_416b0 = *(double *)
                  ((long)&ppVar5[3].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_416a8 = *(double *)
                  ((long)&ppVar5[3].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_416d8 = ppVar5[3].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_416d0 = *(double *)
                  ((long)&ppVar5[3].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_416c8 = *(double *)
                  ((long)&ppVar5[3].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_416f8 = *(double *)
                  &ppVar5[4].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_416f0 = *(double *)
                  ((long)&ppVar5[4].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_416e8 = *(double *)
                  ((long)&ppVar5[4].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41718 = ppVar5[4].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_41710 = *(double *)
                  ((long)&ppVar5[4].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41708 = *(double *)
                  ((long)&ppVar5[4].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41738 = *(double *)
                  &ppVar5[4].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_41730 = *(double *)
                  ((long)&ppVar5[4].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41728 = *(double *)
                  ((long)&ppVar5[4].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41758 = ppVar5[4].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_41750 = *(double *)
                  ((long)&ppVar5[4].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41748 = *(double *)
                  ((long)&ppVar5[4].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41778 = *(double *)
                  &ppVar5[5].first.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>;
  dStack_41770 = *(double *)
                  ((long)&ppVar5[5].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41768 = *(double *)
                  ((long)&ppVar5[5].first.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_41798 = ppVar5[5].first.second.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                 .m_storage.m_data.array[0];
  dStack_41790 = *(double *)
                  ((long)&ppVar5[5].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_41788 = *(double *)
                  ((long)&ppVar5[5].first.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_417b8 = *(double *)
                  &ppVar5[5].second.first.
                   super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage;
  dStack_417b0 = *(double *)
                  ((long)&ppVar5[5].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_417a8 = *(double *)
                  ((long)&ppVar5[5].second.first.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  dStack_417d8 = ppVar5[5].second.second.
                 super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
                 [0];
  dStack_417d0 = *(double *)
                  ((long)&ppVar5[5].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 8);
  dStack_417c8 = *(double *)
                  ((long)&ppVar5[5].second.second.
                          super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> + 0x10);
  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[1] = 0.0;
  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[2] = 4.94065645841247e-324;
  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[3] = 1.48219693752374e-323;
  pEStack_10020 = &EStack_38c68;
  auStack_10038._0_8_ = auStack_410e8;
  paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
  auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_412e8;
  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
  array[0] = (double)auStack_412e8;
  auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
  Eigen::internal::
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
         *)auStack_10038);
  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
  if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage
             .m_data.array[3] +
       (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage
             .m_data.array[1] == 6) &&
     (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[2] == 4.94065645841247e-324)) {
    auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_412e8;
    auVar20._0_8_ =
         Eigen::internal::
         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
         ::
         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                     *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                    (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                     *)&EStack_38c68);
    auVar20._8_8_ = 0;
    auVar20 = sqrtpd(auVar20,auVar20);
    auVar21._0_8_ = auVar20._0_8_;
    auVar21._8_8_ = auVar21._0_8_;
    auStack_412e8 = divpd(auStack_412e8,auVar21);
    auStack_412d8 = divpd(auStack_412d8,auVar21);
    auStack_412c8._0_16_ = divpd(auStack_412c8._0_16_,auVar21);
    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[1] = 0.0;
    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[2] = 4.94065645841247e-324;
    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[3] = 1.48219693752374e-323;
    auStack_41290._0_8_ = &dStack_41558;
    auStack_41290._8_8_ = &dStack_41538;
    auStack_10038._0_8_ = auStack_410e8;
    paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
    auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_41318;
    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data.
    array[0] = (double)auStack_41318;
    auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
    pEStack_10020 = &EStack_38c68;
    Eigen::internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)auStack_10038);
    Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
              ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
    if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
               m_storage.m_data.array[3] +
         (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
               m_storage.m_data.array[1] == 6) &&
       (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[2] == 4.94065645841247e-324)) {
      auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41318;
      auVar22._0_8_ =
           Eigen::internal::
           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
           ::
           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                       *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                       *)&EStack_38c68);
      auVar22._8_8_ = 0;
      auVar20 = sqrtpd(auVar22,auVar22);
      auVar23._0_8_ = auVar20._0_8_;
      auVar23._8_8_ = auVar23._0_8_;
      auStack_41318 = divpd(auStack_41318,auVar23);
      auStack_41308 = divpd(auStack_41308,auVar23);
      auStack_412f8 = divpd(auStack_412f8,auVar23);
      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[1] = 0.0;
      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[2] = 4.94065645841247e-324;
      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[3] = 1.48219693752374e-323;
      auStack_41290._0_8_ = &dStack_41598;
      auStack_41290._8_8_ = &dStack_41578;
      auStack_10038._0_8_ = auStack_410e8;
      paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
      auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_41348;
      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.m_data
      .array[0] = (double)auStack_41348;
      auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
      pEStack_10020 = &EStack_38c68;
      Eigen::internal::
      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
             *)auStack_10038);
      Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
      if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                 m_storage.m_data.array[3] +
           (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                 m_storage.m_data.array[1] == 6) &&
         (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[2] == 4.94065645841247e-324)) {
        auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41348;
        auVar24._0_8_ =
             Eigen::internal::
             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
             ::
             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                         *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                         *)&EStack_38c68);
        auVar24._8_8_ = 0;
        auVar20 = sqrtpd(auVar24,auVar24);
        auVar25._0_8_ = auVar20._0_8_;
        auVar25._8_8_ = auVar25._0_8_;
        auStack_41348 = divpd(auStack_41348,auVar25);
        auStack_41338 = divpd(auStack_41338,auVar25);
        auStack_41328 = divpd(auStack_41328,auVar25);
        MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[1] = 0.0;
        MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[2] = 4.94065645841247e-324;
        MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[3] = 1.48219693752374e-323;
        auStack_41290._0_8_ = &dStack_415d8;
        auStack_41290._8_8_ = &dStack_415b8;
        auStack_10038._0_8_ = auStack_410e8;
        paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
        auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_41378;
        MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
        m_data.array[0] = (double)auStack_41378;
        auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
        pEStack_10020 = &EStack_38c68;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
               *)auStack_10038);
        Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                  ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
        if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                   m_storage.m_data.array[3] +
             (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                   m_storage.m_data.array[1] == 6) &&
           (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[2] == 4.94065645841247e-324)) {
          auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41378;
          auVar26._0_8_ =
               Eigen::internal::
               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
               ::
               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                           *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                           *)&EStack_38c68);
          auVar26._8_8_ = 0;
          auVar20 = sqrtpd(auVar26,auVar26);
          auVar27._0_8_ = auVar20._0_8_;
          auVar27._8_8_ = auVar27._0_8_;
          auStack_41378 = divpd(auStack_41378,auVar27);
          auStack_41368 = divpd(auStack_41368,auVar27);
          auStack_41358 = divpd(auStack_41358,auVar27);
          MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[1] = 0.0;
          MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[2] = 4.94065645841247e-324;
          MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[3] = 1.48219693752374e-323;
          auStack_41290._0_8_ = &dStack_41618;
          auStack_41290._8_8_ = &dStack_415f8;
          auStack_10038._0_8_ = auStack_410e8;
          paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
          auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_413a8;
          MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
          m_data.array[0] = (double)auStack_413a8;
          auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
          pEStack_10020 = &EStack_38c68;
          Eigen::internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
          ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                 *)auStack_10038);
          Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                    ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                     (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
          if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                     m_storage.m_data.array[3] +
               (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                     m_storage.m_data.array[1] == 6) &&
             (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[2] == 4.94065645841247e-324)) {
            auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_413a8;
            auVar28._0_8_ =
                 Eigen::internal::
                 redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                 ::
                 run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                           ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                             *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                            (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                             *)&EStack_38c68);
            auVar28._8_8_ = 0;
            auVar20 = sqrtpd(auVar28,auVar28);
            auVar29._0_8_ = auVar20._0_8_;
            auVar29._8_8_ = auVar29._0_8_;
            auStack_413a8 = divpd(auStack_413a8,auVar29);
            auStack_41398 = divpd(auStack_41398,auVar29);
            auStack_41388 = divpd(auStack_41388,auVar29);
            MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[1] = 0.0;
            MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[2] = 4.94065645841247e-324;
            MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[3] = 1.48219693752374e-323;
            auStack_41290._0_8_ = &dStack_41658;
            auStack_41290._8_8_ = &dStack_41638;
            auStack_10038._0_8_ = auStack_410e8;
            paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
            auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_413d8;
            MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
            m_data.array[0] = (double)auStack_413d8;
            auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
            pEStack_10020 = &EStack_38c68;
            Eigen::internal::
            dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
            ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                   *)auStack_10038);
            Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                      ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                       (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
            if (((long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>
                       .m_storage.m_data.array[3] +
                 (long)MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>
                       .m_storage.m_data.array[1] == 6) &&
               (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[2] == 4.94065645841247e-324)) {
              auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_413d8;
              auVar30._0_8_ =
                   Eigen::internal::
                   redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                   ::
                   run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                             ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                               *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                              (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                               *)&EStack_38c68);
              auVar30._8_8_ = 0;
              auVar20 = sqrtpd(auVar30,auVar30);
              auVar31._0_8_ = auVar20._0_8_;
              auVar31._8_8_ = auVar31._0_8_;
              auStack_413d8 = divpd(auStack_413d8,auVar31);
              auStack_413c8 = divpd(auStack_413c8,auVar31);
              auStack_413b8 = divpd(auStack_413b8,auVar31);
              MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[1] = 0.0;
              MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[2] = 4.94065645841247e-324;
              MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[3] = 1.48219693752374e-323;
              auStack_41290._0_8_ = &dStack_41698;
              auStack_41290._8_8_ = &dStack_41678;
              auStack_10038._0_8_ = auStack_410e8;
              paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
              auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_41408;
              MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
              m_storage.m_data.array[0] = (double)auStack_41408;
              auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
              pEStack_10020 = &EStack_38c68;
              Eigen::internal::
              dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
              ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                     *)auStack_10038);
              Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                         (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
              if (((long)MStack_40c68.
                         super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                         m_data.array[3] +
                   (long)MStack_40c68.
                         super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                         m_data.array[1] == 6) &&
                 (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[2] == 4.94065645841247e-324)) {
                auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41408;
                auVar32._0_8_ =
                     Eigen::internal::
                     redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                     ::
                     run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                               ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                 *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                                (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                 *)&EStack_38c68);
                auVar32._8_8_ = 0;
                auVar20 = sqrtpd(auVar32,auVar32);
                auVar33._0_8_ = auVar20._0_8_;
                auVar33._8_8_ = auVar33._0_8_;
                auStack_41408 = divpd(auStack_41408,auVar33);
                auStack_413f8 = divpd(auStack_413f8,auVar33);
                auStack_413e8 = divpd(auStack_413e8,auVar33);
                MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[1] = 0.0;
                MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[2] = 4.94065645841247e-324;
                MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[3] = 1.48219693752374e-323;
                auStack_41290._0_8_ = &dStack_416d8;
                auStack_41290._8_8_ = &dStack_416b8;
                auStack_10038._0_8_ = auStack_410e8;
                paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
                auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_41438;
                MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                m_storage.m_data.array[0] = (double)auStack_41438;
                auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
                pEStack_10020 = &EStack_38c68;
                Eigen::internal::
                dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                       *)auStack_10038);
                Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                          ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                           (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
                if (((long)MStack_40c68.
                           super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                           m_storage.m_data.array[3] +
                     (long)MStack_40c68.
                           super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                           m_storage.m_data.array[1] == 6) &&
                   (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[2] == 4.94065645841247e-324)) {
                  auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41438;
                  auVar34._0_8_ =
                       Eigen::internal::
                       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                       ::
                       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                 ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                   *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                                  (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                   *)&EStack_38c68);
                  auVar34._8_8_ = 0;
                  auVar20 = sqrtpd(auVar34,auVar34);
                  auVar35._0_8_ = auVar20._0_8_;
                  auVar35._8_8_ = auVar35._0_8_;
                  auStack_41438 = divpd(auStack_41438,auVar35);
                  auStack_41428 = divpd(auStack_41428,auVar35);
                  auStack_41418 = divpd(auStack_41418,auVar35);
                  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[1] = 0.0;
                  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[2] = 4.94065645841247e-324;
                  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[3] = 1.48219693752374e-323;
                  auStack_41290._0_8_ = &dStack_41718;
                  auStack_41290._8_8_ = &dStack_416f8;
                  auStack_10038._0_8_ = auStack_410e8;
                  paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
                  auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_41468;
                  MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                  m_storage.m_data.array[0] = (double)auStack_41468;
                  auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
                  pEStack_10020 = &EStack_38c68;
                  Eigen::internal::
                  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                         *)auStack_10038);
                  Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                            ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
                  if (((long)MStack_40c68.
                             super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                             m_storage.m_data.array[3] +
                       (long)MStack_40c68.
                             super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                             m_storage.m_data.array[1] == 6) &&
                     (MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[2] == 4.94065645841247e-324)) {
                    auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41468;
                    auVar36._0_8_ =
                         Eigen::internal::
                         redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                         ::
                         run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                   ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                     *)auStack_10038,(scalar_sum_op<double,_double> *)&MStack_40c68,
                                    (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                     *)&EStack_38c68);
                    auVar36._8_8_ = 0;
                    auVar20 = sqrtpd(auVar36,auVar36);
                    auVar37._0_8_ = auVar20._0_8_;
                    auVar37._8_8_ = auVar37._0_8_;
                    auStack_41468 = divpd(auStack_41468,auVar37);
                    auStack_41458 = divpd(auStack_41458,auVar37);
                    auStack_41448 = divpd(auStack_41448,auVar37);
                    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[1] = 0.0;
                    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[2] = 4.94065645841247e-324;
                    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[3] = 1.48219693752374e-323;
                    auStack_41290._0_8_ = &dStack_41758;
                    auStack_41290._8_8_ = &dStack_41738;
                    auStack_10038._0_8_ = auStack_410e8;
                    paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
                    auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_41498;
                    MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                    m_storage.m_data.array[0] = (double)auStack_41498;
                    auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
                    pEStack_10020 = &EStack_38c68;
                    Eigen::internal::
                    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                           *)auStack_10038);
                    Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                              ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
                    if (((long)MStack_40c68.
                               super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                               m_storage.m_data.array[3] +
                         (long)MStack_40c68.
                               super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                               m_storage.m_data.array[1] == 6) &&
                       (MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[2] == 4.94065645841247e-324)) {
                      auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_41498;
                      auVar38._0_8_ =
                           Eigen::internal::
                           redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                           ::
                           run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                     ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                       *)auStack_10038,
                                      (scalar_sum_op<double,_double> *)&MStack_40c68,
                                      (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                       *)&EStack_38c68);
                      auVar38._8_8_ = 0;
                      auVar20 = sqrtpd(auVar38,auVar38);
                      auVar39._0_8_ = auVar20._0_8_;
                      auVar39._8_8_ = auVar39._0_8_;
                      auStack_41498 = divpd(auStack_41498,auVar39);
                      auStack_41488 = divpd(auStack_41488,auVar39);
                      auStack_41478 = divpd(auStack_41478,auVar39);
                      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[1] = 0.0;
                      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[2] = 4.94065645841247e-324;
                      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[3] = 1.48219693752374e-323;
                      auStack_41290._0_8_ = &dStack_41798;
                      auStack_41290._8_8_ = &dStack_41778;
                      auStack_10038._0_8_ = auStack_410e8;
                      paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
                      auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_414c8;
                      MStack_40c68.super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                      m_storage.m_data.array[0] = (double)auStack_414c8;
                      auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
                      pEStack_10020 = &EStack_38c68;
                      Eigen::internal::
                      dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                      ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                             *)auStack_10038);
                      Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                                ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)&MStack_40c68,
                                 (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68);
                      if (((long)MStack_40c68.
                                 super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                                 m_storage.m_data.array[3] +
                           (long)MStack_40c68.
                                 super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                                 m_storage.m_data.array[1] == 6) &&
                         (MStack_40c68.
                          super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage
                          .m_data.array[2] == 4.94065645841247e-324)) {
                        auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_414c8;
                        auVar40._0_8_ =
                             Eigen::internal::
                             redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                             ::
                             run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                       ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                         *)auStack_10038,
                                        (scalar_sum_op<double,_double> *)&MStack_40c68,
                                        (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                         *)&EStack_38c68);
                        auVar40._8_8_ = 0;
                        auVar20 = sqrtpd(auVar40,auVar40);
                        auVar41._0_8_ = auVar20._0_8_;
                        auVar41._8_8_ = auVar41._0_8_;
                        auStack_414c8 = divpd(auStack_414c8,auVar41);
                        auStack_414b8 = divpd(auStack_414b8,auVar41);
                        auStack_414a8 = divpd(auStack_414a8,auVar41);
                        MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[1] = 0.0;
                        MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[2] = 4.94065645841247e-324;
                        MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[3] = 1.48219693752374e-323;
                        auStack_41290._0_8_ = &dStack_417d8;
                        auStack_41290._8_8_ = &dStack_417b8;
                        auStack_10038._0_8_ = auStack_410e8;
                        paStack_10028 = (assign_op<double,_double> *)&MStack_40f28;
                        auStack_410e8._0_8_ = (SrcEvaluatorType *)auStack_40f58;
                        MStack_40c68.
                        super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.m_storage.
                        m_data.array[0] = (double)auStack_40f58;
                        auStack_10038._8_8_ = (SrcEvaluatorType *)&dStack_41298;
                        pEStack_10020 = &EStack_38c68;
                        Eigen::internal::
                        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
                        ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
                               *)auStack_10038);
                        auVar45._0_8_ = dStack_417a8 * dStack_417d8 - dStack_417c8 * dStack_417b8;
                        auVar45._8_8_ = 0;
                        Eigen::CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>>::operator_
                                  ((CommaInitializer<Eigen::Matrix<double,6,1,0,6,1>> *)
                                   &MStack_40c68,
                                   (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&EStack_38c68
                                  );
                        if (((long)MStack_40c68.
                                   super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                                   m_storage.m_data.array[3] +
                             (long)MStack_40c68.
                                   super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                                   m_storage.m_data.array[1] == 6) &&
                           (MStack_40c68.
                            super_PlainObjectBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>.
                            m_storage.m_data.array[2] == 4.94065645841247e-324)) {
                          auStack_10038._8_8_ = (SrcEvaluatorType *)auStack_40f58;
                          auVar42._0_8_ =
                               Eigen::internal::
                               redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,-1,1,false>const>>,3,0>
                               ::
                               run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,_1,1,false>const>>
                                         ((redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>_>
                                           *)auStack_10038,
                                          (scalar_sum_op<double,_double> *)&MStack_40c68,
                                          (CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,__1,_1,_false>_>
                                           *)&EStack_38c68);
                          auVar42._8_8_ = 0;
                          auVar20 = sqrtpd(auVar45,auVar42);
                          auVar46._0_8_ = auVar20._0_8_;
                          auVar46._8_8_ = auVar46._0_8_;
                          auStack_40f58 = divpd(auStack_40f58,auVar46);
                          auStack_40f48 = divpd(auStack_40f48,auVar46);
                          auStack_40f38 = divpd(auStack_40f38,auVar46);
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0] = (double)auStack_412e8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[1] = (double)auStack_412e8._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[2] = (double)auStack_412d8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[3] = (double)auStack_412d8._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[4] = (double)auStack_412c8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[5] = (double)auStack_412c8._8_8_;
                          auStack_410e8._0_8_ = auStack_41318._0_8_;
                          auStack_410e8._8_8_ = auStack_41318._8_8_;
                          auStack_410e8._16_8_ = auStack_41308._0_8_;
                          auStack_410e8._24_8_ = auStack_41308._8_8_;
                          auStack_410e8._32_8_ = auStack_412f8._0_8_;
                          auStack_410e8._40_8_ = auStack_412f8._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[6] = (double)auStack_41348._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[7] = (double)auStack_41348._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[8] = (double)auStack_41338._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[9] = (double)auStack_41338._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[10] = (double)auStack_41328._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xb] = (double)auStack_41328._8_8_;
                          auStack_410e8._48_8_ = auStack_41378._0_8_;
                          pStack_410b0.data = (double *)auStack_41378._8_8_;
                          pStack_410a8.data = (double *)auStack_41368._0_8_;
                          uStack_410a0 = auStack_41368._8_8_;
                          uStack_41098 = auStack_41358._0_8_;
                          uStack_41090 = auStack_41358._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xc] = (double)auStack_413a8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xd] = (double)auStack_413a8._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xe] = (double)auStack_41398._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0xf] = (double)auStack_41398._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x10] = (double)auStack_41388._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x11] = (double)auStack_41388._8_8_;
                          DStack_41088._0_8_ = auStack_413d8._0_8_;
                          DStack_41088.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_413d8._8_8_;
                          DStack_41088.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_413c8._0_8_;
                          uStack_41070 = auStack_413c8._8_8_;
                          uStack_41068 = auStack_413b8._0_8_;
                          uStack_41060 = auStack_413b8._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x12] = (double)auStack_41408._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x13] = (double)auStack_41408._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x14] = (double)auStack_413f8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x15] = (double)auStack_413f8._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x16] = (double)auStack_413e8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x17] = (double)auStack_413e8._8_8_;
                          DStack_41058._0_8_ = auStack_41438._0_8_;
                          DStack_41058.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41438._8_8_;
                          DStack_41058.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41428._0_8_;
                          uStack_41040 = auStack_41428._8_8_;
                          uStack_41038 = auStack_41418._0_8_;
                          uStack_41030 = auStack_41418._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x18] = (double)auStack_41468._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x19] = (double)auStack_41468._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1a] = (double)auStack_41458._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1b] = (double)auStack_41458._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1c] = (double)auStack_41448._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1d] = (double)auStack_41448._8_8_;
                          DStack_41028._0_8_ = auStack_41498._0_8_;
                          DStack_41028.lhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41498._8_8_;
                          DStack_41028.rhsImpl.
                          super_evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          .m_d.data = (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      (evaluator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>)
                                      auStack_41488._0_8_;
                          uStack_41010 = auStack_41488._8_8_;
                          uStack_41008 = auStack_41478._0_8_;
                          uStack_41000 = auStack_41478._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1e] = (double)auStack_414c8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x1f] = (double)auStack_414c8._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x20] = (double)auStack_414b8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x21] = (double)auStack_414b8._8_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x22] = (double)auStack_414a8._0_8_;
                          MStack_40f28.super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>.
                          m_storage.m_data.array[0x23] = (double)auStack_414a8._8_8_;
                          auStack_40ff8 = auStack_40f58;
                          auStack_40fe8 = auStack_40f48;
                          auStack_40fd8 = auStack_40f38;
                          vStack_417f8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
                          vStack_417f8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          vStack_417f8.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
                          vStack_41818.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage =
                               (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
                          vStack_41818.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                          vStack_41818.
                          super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish =
                               (Matrix<double,_6,_1,_0,_6,_1> *)0x0;
                          lVar11 = 0x20;
                          do {
                            dVar13 = *(double *)((long)adStack_41108 + lVar11);
                            dVar1 = *(double *)((long)adStack_41108 + lVar11 + 8U);
                            dVar2 = *(double *)((long)adStack_41108 + lVar11 + 0x10U);
                            dVar3 = *(double *)((long)adStack_41108 + lVar11 + 0x18U);
                            dVar19 = *(double *)(auStack_410e8 + lVar11 + 8);
                            if (vStack_417f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                vStack_417f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                              ::_M_realloc_insert<Eigen::Matrix<double,6,1,0,6,1>>
                                        ((vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                                          *)&vStack_417f8,
                                         (iterator)
                                         vStack_417f8.
                                         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                                         (Matrix<double,_6,_1,_0,_6,_1> *)&EStack_38c68);
                            }
                            else {
                              ((vStack_417f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[4] = *(double *)(auStack_410e8 + lVar11);
                              ((vStack_417f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[5] = dVar19;
                              ((vStack_417f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[2] = dVar2;
                              ((vStack_417f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[3] = dVar3;
                              ((vStack_417f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[0] = dVar13;
                              ((vStack_417f8.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[1] = dVar1;
                              vStack_417f8.
                              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   vStack_417f8.
                                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            dVar13 = *(double *)(auStack_40f48 + lVar11);
                            dVar1 = *(double *)(auStack_40f48 + lVar11 + 8);
                            dVar2 = *(double *)(auStack_40f38 + lVar11);
                            dVar3 = *(double *)(auStack_40f38 + lVar11 + 8);
                            dVar19 = *(double *)
                                      ((long)MStack_40f28.
                                             super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                             .m_storage.m_data.array + lVar11 + 8);
                            if (vStack_41818.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish ==
                                vStack_41818.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                              std::
                              vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                              ::_M_realloc_insert<Eigen::Matrix<double,6,1,0,6,1>>
                                        ((vector<Eigen::Matrix<double,6,1,0,6,1>,Eigen::aligned_allocator<Eigen::Matrix<double,6,1,0,6,1>>>
                                          *)&vStack_41818,
                                         (iterator)
                                         vStack_41818.
                                         super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish,
                                         (Matrix<double,_6,_1,_0,_6,_1> *)&EStack_38c68);
                            }
                            else {
                              ((vStack_41818.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[4] =
                                   *(double *)
                                    ((long)MStack_40f28.
                                           super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                           .m_storage.m_data.array + lVar11);
                              ((vStack_41818.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[5] = dVar19;
                              ((vStack_41818.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[2] = dVar2;
                              ((vStack_41818.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[3] = dVar3;
                              ((vStack_41818.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[0] = dVar13;
                              ((vStack_41818.
                                super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish)->
                              super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>).
                              m_storage.m_data.array[1] = dVar1;
                              vStack_41818.
                              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish =
                                   vStack_41818.
                                   super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + 1;
                            }
                            lVar11 = lVar11 + 0x30;
                          } while (lVar11 != 0x140);
                          memset(&MStack_40c68,0,0x8000);
                          setupAction<double>(&vStack_417f8,&vStack_41818,&MStack_40c68);
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0] = 1.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[1] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[2] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[3] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[4] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[5] = 1.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[6] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[7] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[8] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[9] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[10] = 1.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xb] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xc] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xd] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xe] = 0.0;
                          MStack_40d98.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[0xf] = 1.0;
                          memset(&EStack_38c68.m_eivalues,0,0x402);
                          Eigen::EigenSolver<Eigen::Matrix<double,64,64,0,64,64>>::
                          compute<Eigen::Matrix<double,64,64,0,64,64>>
                                    ((EigenSolver<Eigen::Matrix<double,64,64,0,64,64>> *)
                                     &EStack_38c68,
                                     (EigenBase<Eigen::Matrix<double,_64,_64,_0,_64,_64>_> *)
                                     &MStack_40c68,true);
                          Eigen::EigenSolver<Eigen::Matrix<double,_64,_64,_0,_64,_64>_>::
                          eigenvectors((EigenvectorsType *)auStack_10038,&EStack_38c68);
                          std::
                          vector<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                          ::reserve(__return_storage_ptr__,0x40);
                          puVar16 = local_fc70;
                          lVar11 = 0;
                          bVar17 = false;
                          do {
                            lVar12 = 0;
                            lStack_41820 = lVar11;
                            do {
                              auVar20 = __divdc3(*(undefined8 *)(puVar16 + lVar12 * 2 + -8),
                                                 *(undefined8 *)(puVar16 + lVar12 * 2),
                                                 auStack_fc48[lVar11 * 0x80],
                                                 auStack_fc48[lVar11 * 0x80 + 1]);
                              *(double *)
                               ((long)MStack_40d10.
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data.array + lVar12) = auVar20._0_8_;
                              if (1e-06 <= ABS(auVar20._8_8_)) {
                                bVar17 = true;
                              }
                              if (NAN(auVar20._0_8_)) {
                                bVar17 = true;
                              }
                              lVar12 = lVar12 + 8;
                            } while (lVar12 != 0x18);
                            if (bVar17) {
                              bVar17 = false;
                              lVar11 = lStack_41820;
                            }
                            else {
                              cayley2rot<double>(&MStack_40d10);
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0] = dStack_41298;
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[1] = (double)auStack_41290._16_8_;
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[2] = (double)pMStack_41268;
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[3] = (double)auStack_41290._0_8_;
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[4] = (double)pdStack_41278;
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[5] = (double)vStack_41260.m_value;
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[6] = (double)auStack_41290._8_8_;
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[7] = dStack_41270;
                              MStack_41518.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[8] = (double)vStack_41258.m_value;
                              lVar11 = 0;
                              dVar13 = 0.0;
                              do {
                                pdStack_41278 = (PointerType)(auStack_410e8 + lVar11);
                                pdStack_41228 =
                                     (PointerType)
                                     ((long)MStack_40f28.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                            .m_storage.m_data.array + lVar11);
                                auStack_41290._0_8_ = auStack_410e8 + lVar11 + 0x18;
                                pdStack_41160 =
                                     (PointerType)
                                     ((long)MStack_40f28.
                                            super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                            .m_storage.m_data.array + lVar11 + 0x18);
                                auStack_41290._8_8_ = (double *)0x3;
                                pMStack_41268 = (XprTypeNested)auStack_410e8;
                                vStack_41260.m_value = 0;
                                dStack_41250 = 2.96439387504748e-323;
                                vStack_41248.m_value = 3;
                                dStack_41238 = 2.96439387504748e-323;
                                pMStack_41230 = &MStack_41518;
                                vStack_41220.m_value = 3;
                                pMStack_41200 = &MStack_40f28;
                                vStack_411f8.m_value = 0;
                                IStack_411e8 = 6;
                                vStack_411e0.m_value = 0;
                                IStack_411d0 = 6;
                                vStack_411c0.m_value = 3;
                                vStack_41198.m_value = 0;
                                IStack_41188 = 6;
                                vStack_41180.m_value = 0;
                                IStack_41170 = 6;
                                vStack_41158.m_value = 3;
                                vStack_41130.m_value = 0;
                                IStack_41120 = 6;
                                vStack_41118.m_value = 3;
                                adStack_41108[0] = 2.96439387504748e-323;
                                vStack_41258.m_value = (long)dVar13;
                                pdStack_41210 = pdStack_41228;
                                vStack_411f0.m_value = (long)dVar13;
                                pdStack_411c8 = pdStack_41278;
                                pdStack_411b0 = pdStack_41278;
                                pMStack_411a0 = pMStack_41268;
                                vStack_41190.m_value = (long)dVar13;
                                pMStack_41168 = pMStack_41230;
                                pdStack_41148 = pdStack_41228;
                                pMStack_41138 = pMStack_41200;
                                vStack_41128.m_value = (long)dVar13;
                                Eigen::internal::
                                binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_6,_1,_true>,_-1,_1,_false>,_0>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                                ::Data::Data((Data *)(auStack_40e08 + 8),(XprType *)auStack_41290);
                                adStack_40f88[(long)dVar13] = -(*pdStack_40df8 + *pdStack_40de8);
                                dVar1 = *(double *)
                                         ((long)MStack_40f28.
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                                .m_storage.m_data.array + lVar11);
                                dVar2 = *(double *)
                                         ((long)MStack_40f28.
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                                .m_storage.m_data.array + lVar11 + 8);
                                dVar3 = *(double *)
                                         ((long)MStack_40f28.
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_0,_6,_6>_>
                                                .m_storage.m_data.array + lVar11 + 0x10);
                                dVar19 = dVar3 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[6] +
                                         dVar2 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[3] +
                                         dVar1 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[0];
                                dVar43 = dVar3 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[7] +
                                         dVar2 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[4] +
                                         dVar1 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[1];
                                dVar44 = dVar3 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[8] +
                                         dVar2 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[5] +
                                         dVar1 * MStack_41518.
                                                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                                 .m_storage.m_data.array[2];
                                dVar1 = *(double *)(auStack_410e8 + lVar11 + 0x10);
                                dVar2 = *(double *)(auStack_410e8 + lVar11);
                                dVar3 = *(double *)(auStack_410e8 + lVar11 + 8);
                                MStack_40cf8.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[(long)dVar13] =
                                     dVar1 * dVar43 - dVar44 * dVar3;
                                MStack_40cf8.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[(long)dVar13 + 6] =
                                     dVar2 * dVar44 - dVar1 * dVar19;
                                MStack_40cf8.
                                super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>.
                                m_storage.m_data.array[(long)dVar13 + 0xc] =
                                     dVar19 * dVar3 - dVar43 * dVar2;
                                dVar13 = (double)((long)dVar13 + 1);
                                lVar11 = lVar11 + 0x30;
                              } while (lVar11 != 0x120);
                              SStack_412b0.m_xpr.m_lhs.m_matrix = &MStack_40cf8;
                              SStack_412b0.m_xpr.m_rhs = SStack_412b0.m_xpr.m_lhs.m_matrix;
                              pMStack_412a0 = SStack_412b0.m_xpr.m_lhs.m_matrix;
                              Eigen::internal::
                              Assignment<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
                              ::run((Matrix<double,_3,_3,_0,_3,_3> *)auStack_40e08,&SStack_412b0,
                                    &aStack_41821);
                              dVar19 = dStack_40dc8;
                              dVar3 = dStack_40dd0;
                              dVar2 = dStack_40dd8;
                              dVar1 = dStack_40de0;
                              pdVar9 = pdStack_40de8;
                              dVar13 = dStack_40df0;
                              pdVar8 = pdStack_40df8;
                              uVar7 = auStack_40e08._8_8_;
                              uVar6 = auStack_40e08._0_8_;
                              lVar11 = lStack_41820;
                              pMStack_40dc0 = pMStack_412a0;
                              pMStack_40db8 = (Matrix<double,_3,_3,_0,_3,_3> *)auStack_40e08;
                              pMStack_40db0 = pMStack_412a0;
                              adStack_40da8[0] = 1.48219693752374e-323;
                              lVar12 = -0x30;
                              pdVar10 = (double *)(auStack_41290 + 8);
                              do {
                                dVar43 = *(double *)
                                          ((long)(pMStack_412a0->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                                 ).m_storage.m_data.array + lVar12 + 0x30);
                                dVar44 = *(double *)
                                          ((long)(pMStack_412a0->
                                                 super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                                 ).m_storage.m_data.array + lVar12 + 0x60);
                                dVar4 = *(double *)
                                         ((long)pMStack_412a0[1].
                                                super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                                .m_storage.m_data.array + lVar12);
                                pdVar10[-2] = dVar4 * dVar2 +
                                              dVar44 * dVar13 + dVar43 * (double)uVar6;
                                pdVar10[-1] = dVar4 * dVar3 +
                                              dVar44 * (double)pdVar9 + dVar43 * (double)uVar7;
                                *pdVar10 = *(double *)
                                            ((long)pMStack_412a0[1].
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                                  .m_storage.m_data.array + lVar12) * dVar19 +
                                           *(double *)
                                            ((long)(pMStack_412a0->
                                                                                                      
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                                  ).m_storage.m_data.array + lVar12 + 0x60) * dVar1
                                           + *(double *)
                                              ((long)(pMStack_412a0->
                                                                                                          
                                                  super_PlainObjectBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>
                                                  ).m_storage.m_data.array + lVar12 + 0x30) *
                                             (double)pdVar8;
                                pdVar10 = pdVar10 + 3;
                                lVar12 = lVar12 + 8;
                              } while (lVar12 != 0);
                              lVar12 = 0x10;
                              pdVar10 = MStack_41518.
                                        super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
                                        .m_storage.m_data.array + 2;
                              do {
                                dVar13 = pdVar10[-1];
                                *(double *)((long)adStack_40da8 + lVar12) =
                                     ((plain_array<double,_9,_0,_0> *)(pdVar10 + -2))->array[0];
                                *(double *)((long)adStack_40da8 + lVar12 + 8) = dVar13;
                                *(double *)
                                 ((long)MStack_40d98.
                                        super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>
                                        .m_storage.m_data.array + lVar12) = *pdVar10;
                                pdVar10 = pdVar10 + 3;
                                lVar12 = lVar12 + 0x20;
                              } while (lVar12 != 0x70);
                              MStack_40d98.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                              .m_data.array[0xc] =
                                   dStack_40f60 * (double)vStack_41220.m_value +
                                   dStack_40f68 * dStack_41238 +
                                   adStack_40f88[3] * dStack_41250 +
                                   adStack_40f88[2] * (double)pMStack_41268 +
                                   (double)auStack_41290._16_8_ * adStack_40f88[1] +
                                   adStack_40f88[0] * dStack_41298;
                              MStack_40d98.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                              .m_data.array[0xd] =
                                   dStack_40f60 * dStack_41218 +
                                   dStack_40f68 * (double)pMStack_41230 +
                                   adStack_40f88[3] * (double)vStack_41248.m_value +
                                   adStack_40f88[2] * (double)vStack_41260.m_value +
                                   (double)pdStack_41278 * adStack_40f88[1] +
                                   adStack_40f88[0] * (double)auStack_41290._0_8_;
                              MStack_40d98.
                              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage
                              .m_data.array[0xe] =
                                   dStack_40f60 * (double)pdStack_41210 +
                                   dStack_40f68 * (double)pdStack_41228 +
                                   adStack_40f88[3] * dStack_41240 +
                                   adStack_40f88[2] * (double)vStack_41258.m_value +
                                   adStack_40f88[1] * dStack_41270 +
                                   adStack_40f88[0] * (double)auStack_41290._8_8_;
                              __position._M_current =
                                   (__return_storage_ptr__->
                                   super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish;
                              if (__position._M_current ==
                                  (__return_storage_ptr__->
                                  super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                  )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                                std::
                                vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                                ::_M_realloc_insert<Eigen::Matrix<double,4,4,0,4,4>const&>
                                          ((vector<Eigen::Matrix<double,4,4,0,4,4>,std::allocator<Eigen::Matrix<double,4,4,0,4,4>>>
                                            *)__return_storage_ptr__,__position,&MStack_40d98);
                              }
                              else {
                                pMVar14 = &MStack_40d98;
                                iVar15._M_current = __position._M_current;
                                for (lVar12 = 0x10; lVar12 != 0; lVar12 = lVar12 + -1) {
                                  ((iVar15._M_current)->
                                  super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).
                                  m_storage.m_data.array[0] =
                                       (pMVar14->
                                       super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>)
                                       .m_storage.m_data.array[0];
                                  pMVar14 = (Matrix<double,_4,_4,_0,_4,_4> *)
                                            ((long)pMVar14 + ((ulong)bVar18 * -2 + 1) * 8);
                                  iVar15._M_current =
                                       (Matrix<double,_4,_4,_0,_4,_4> *)
                                       ((long)iVar15._M_current + ((ulong)bVar18 * -2 + 1) * 8);
                                }
                                (__return_storage_ptr__->
                                super__Vector_base<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish =
                                     __position._M_current + 1;
                              }
                            }
                            lVar11 = lVar11 + 1;
                            puVar16 = puVar16 + 0x400;
                          } while (lVar11 != 0x40);
                          if (vStack_41818.
                              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(vStack_41818.
                                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                          }
                          if (vStack_417f8.
                              super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            free(vStack_417f8.
                                 super__Vector_base<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
                          }
                          return __return_storage_ptr__;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 6, 1>>::finished() [MatrixType = Eigen::Matrix<double, 6, 1>]"
               );
}

Assistant:

std::vector<Eigen::Matrix<floatPrec,4,4>> solver6L(
  std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> ptPair,
	std::vector<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>> plPair,
	std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lPair,
  std::vector<std::pair<std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>,std::pair<Eigen::Matrix<floatPrec,4,1>, Eigen::Matrix<floatPrec,4,1>>>> lCPair
  )
{

  std::vector<Eigen::Matrix<floatPrec,4,4>> solutions;

  // parse inputs
	Eigen::Matrix<floatPrec,3,1> Q11, Q12, R11_B, R12_B, Q21, Q22, R21_B, R22_B, 
  Q31, Q32, R31_B, R32_B, Q41, Q42, R41_B, R42_B, Q51, Q52, R51_B, R52_B, Q61, Q62, R61_B, R62_B;
	
	Q11   = lPair[0].first.first.head(3);  Q12   = lPair[0].first.second.head(3);
	R11_B = lPair[0].second.first.head(3); R12_B = lPair[0].second.second.head(3);
	Q21   = lPair[1].first.first.head(3);  Q22   = lPair[1].first.second.head(3);
	R21_B = lPair[1].second.first.head(3); R22_B = lPair[1].second.second.head(3);
	Q31   = lPair[2].first.first.head(3);  Q32   = lPair[2].first.second.head(3);
	R31_B = lPair[2].second.first.head(3); R32_B = lPair[2].second.second.head(3);
  Q41   = lPair[3].first.first.head(3);  Q42   = lPair[3].first.second.head(3);
	R41_B = lPair[3].second.first.head(3); R42_B = lPair[3].second.second.head(3);
	Q51   = lPair[4].first.first.head(3);  Q52   = lPair[4].first.second.head(3);
	R51_B = lPair[4].second.first.head(3); R52_B = lPair[4].second.second.head(3);
	Q61   = lPair[5].first.first.head(3);  Q62   = lPair[5].first.second.head(3);
	R61_B = lPair[5].second.first.head(3); R62_B = lPair[5].second.second.head(3);

  Eigen::Matrix<floatPrec,6,1> L11, L12, L21, L22, L31, L32;
  Eigen::Matrix<floatPrec,6,1> L41, L42, L51, L52, L61, L62;
  L11 << Q12 - Q11, Q11.cross(Q12); L11 /= L11.head(3).norm();
  L12 << R12_B - R11_B, R11_B.cross(R12_B); L12 /= L12.head(3).norm();
  L21 << Q22 - Q21, Q21.cross(Q22); L21 /= L21.head(3).norm();
  L22 << R22_B - R21_B, R21_B.cross(R22_B); L22 /= L22.head(3).norm();
  L31 << Q32 - Q31, Q31.cross(Q32); L31 /= L31.head(3).norm();
  L32 << R32_B - R31_B, R31_B.cross(R32_B); L32 /= L32.head(3).norm();
  L41 << Q42 - Q41, Q41.cross(Q42); L41 /= L41.head(3).norm();
  L42 << R42_B - R41_B, R41_B.cross(R42_B); L42 /= L42.head(3).norm();
  L51 << Q52 - Q51, Q51.cross(Q52); L51 /= L51.head(3).norm();
  L52 << R52_B - R51_B, R51_B.cross(R52_B); L52 /= L52.head(3).norm();
  L61 << Q62 - Q61, Q61.cross(Q62); L61 /= L61.head(3).norm();
  L62 << R62_B - R61_B, R61_B.cross(R62_B); L62 /= L62.head(3).norm();

  Eigen::Matrix<floatPrec,6,6> L1,L2,L3;
  L2.col(0) = L11; L1.col(0) = L12; 
  L2.col(1) = L21; L1.col(1) = L22;
  L2.col(2) = L31; L1.col(2) = L32;
  L2.col(3) = L41; L1.col(3) = L42;
  L2.col(4) = L51; L1.col(4) = L52;
  L2.col(5) = L61; L1.col(5) = L62;
  // L3 = L2;
  // L2 = L1;
  // L1 = L3;

  // std::cout << "Lines in solve6L" << std::endl;
  // std::cout << L1 << std::endl;
  // std::cout << std::endl <<  L2 << std::endl;
  
  //create vectors of Pluecker coordinates
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L1vec;
  std::vector< Eigen::Matrix<floatPrec,6,1>, Eigen::aligned_allocator<Eigen::Matrix<floatPrec,6,1> > > L2vec;
  for(int i = 0; i < 6; i++ )
  {
    L1vec.push_back( L1.col(i) );
    L2vec.push_back( L2.col(i) );
  }
  
  //setup the action matrix
  Eigen::Matrix<floatPrec,64,64> Action = Eigen::Matrix<floatPrec,64,64>::Zero();
  setupAction<floatPrec>( L1vec, L2vec, Action );
  
  Eigen::Matrix<floatPrec, 6,3> A;
  Eigen::Matrix<floatPrec, 6,1> k;
  Eigen::Matrix<floatPrec, 3,1> eD2;
  Eigen::Matrix<floatPrec, 3,3> RotationEstimate;
  Eigen::Matrix<floatPrec, 3,1> TranslationEstimate;
  Eigen::Matrix<floatPrec, 4,4> TransformationEstimate = Eigen::Matrix<floatPrec, 4,4>::Identity(4,4);
  floatPrec d11, d12, d13, d21, d22, d23;

  
  //finally eigen-decompose the action-matrix and obtain the solutions
  Eigen::EigenSolver< Eigen::Matrix<floatPrec,64,64> > Eig(Action,true);
  Eigen::Matrix<std::complex<floatPrec>,64,64> EV = Eig.eigenvectors();
  
  bool isComplex = false;

  solutions.reserve(64);  
  for( int c = 0; c < 64; c++ )
  {
    Eigen::Matrix<floatPrec,3,1> solution;
    for( int r = 0; r < 3; r++ )
    {
      std::complex<floatPrec> temp = EV(60+r,c)/EV(63,c);
      solution[r] = temp.real(); // should we remove the complex solution????
      if(std::abs(temp.imag()) >= 0.000001 )
        isComplex = true;
      if(std::isnan(solution[r]))
        isComplex = true;
    }

    if(isComplex) isComplex = false; 
    else{
      RotationEstimate = cayley2rot<floatPrec>(solution).transpose();
      for (unsigned int iter = 0; iter < 6 ; iter++){
        k.row(iter) = -(L1.col(iter).tail(3).transpose() * RotationEstimate * L2.col(iter).head(3) +
                      L1.col(iter).head(3).transpose() * RotationEstimate * L2.col(iter).tail(3));

        d11 = L1(0,iter); d12 = L1(1,iter) ; d13 = L1(2,iter);
        eD2 = RotationEstimate*(L2.col(iter).head(3));
        d21 = eD2(0); d22 = eD2(1) ; d23 = eD2(2);

        A(iter,0) =  d13*d22 - d12*d23;
        A(iter,1) = -d13*d21 + d11*d23;
        A(iter,2) =  d12*d21 - d11*d22;
      }

      TranslationEstimate = (A.transpose()*A).inverse()*(A.transpose())*k;

      TransformationEstimate.topLeftCorner(3,3) = RotationEstimate;
      TransformationEstimate.topRightCorner(3,1) = TranslationEstimate;

      solutions.push_back(TransformationEstimate);
    } 
  
    // std::cout << std::endl << std::endl << "the number of solutions that comes out of here are: " << cayley2rot<floatPrec>(solution).transpose() << std::endl << std::endl;
  }


  return solutions;

}